

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O3

_Bool Curl_pipeline_site_blacklisted(SessionHandle *handle,connectdata *conn)

{
  undefined8 *puVar1;
  int iVar2;
  curl_llist *pcVar3;
  curl_llist_element *pcVar4;
  
  if ((handle->multi != (Curl_multi *)0x0) &&
     (pcVar3 = Curl_multi_pipelining_site_bl(handle->multi), pcVar3 != (curl_llist *)0x0)) {
    for (pcVar4 = pcVar3->head; pcVar4 != (curl_llist_element *)0x0; pcVar4 = pcVar4->next) {
      puVar1 = (undefined8 *)pcVar4->ptr;
      iVar2 = Curl_raw_equal((char *)*puVar1,(conn->host).name);
      if ((iVar2 != 0) && (conn->remote_port == (uint)*(ushort *)(puVar1 + 1))) {
        Curl_infof(handle,"Site %s:%d is pipeline blacklisted\n",(conn->host).name);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Curl_pipeline_site_blacklisted(struct SessionHandle *handle,
                                    struct connectdata *conn)
{
  if(handle->multi) {
    struct curl_llist *blacklist =
      Curl_multi_pipelining_site_bl(handle->multi);

    if(blacklist) {
      struct curl_llist_element *curr;

      curr = blacklist->head;
      while(curr) {
        struct site_blacklist_entry *site;

        site = curr->ptr;
        if(Curl_raw_equal(site->hostname, conn->host.name) &&
           site->port == conn->remote_port) {
          infof(handle, "Site %s:%d is pipeline blacklisted\n",
                conn->host.name, conn->remote_port);
          return TRUE;
        }
        curr = curr->next;
      }
    }
  }
  return FALSE;
}